

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::TestClearNamedBufferData<unsigned_short,false>
          (ClearTest *this,GLenum internalformat,GLsizei count,GLenum format,GLenum type,
          unsigned_short *data)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  unsigned_short *data_00;
  unsigned_short *_data;
  GLuint local_34;
  bool is_error;
  bool is_ok;
  long lStack_30;
  GLuint buffer;
  Functions *gl;
  unsigned_short *data_local;
  GLenum type_local;
  GLenum format_local;
  GLsizei count_local;
  GLenum internalformat_local;
  ClearTest *this_local;
  
  gl = (Functions *)data;
  data_local._0_4_ = type;
  data_local._4_4_ = format;
  type_local = count;
  format_local = internalformat;
  _count_local = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar2);
  local_34 = 0;
  (**(code **)(lStack_30 + 0x3b8))(1,&local_34);
  dVar3 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar3,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x374);
  (*this->m_pNamedBufferData)(local_34,type_local * 2,(GLvoid *)0x0,0x88ea);
  dVar3 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar3,"glNamedBufferData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x377);
  ClearNamedBuffer<false>
            (this,local_34,format_local,type_local * 2,data_local._4_4_,(GLenum)data_local,gl);
  (**(code **)(lStack_30 + 0x40))(0x8892,local_34);
  dVar3 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x37d);
  data_00 = (unsigned_short *)(**(code **)(lStack_30 + 0xcf8))(0x8892,35000);
  dVar3 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar3,"glMapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x380);
  bVar1 = Compare<unsigned_short>(this,data_00,(unsigned_short *)gl,type_local);
  if (!bVar1) {
    LogFail<unsigned_short>(this,false,format_local,data_00,(unsigned_short *)gl,type_local);
  }
  (**(code **)(lStack_30 + 0x1670))(0x8892);
  dVar3 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x38b);
  if (local_34 != 0) {
    (**(code **)(lStack_30 + 0x438))(1,&local_34);
    dVar3 = (**(code **)(lStack_30 + 0x800))();
    glu::checkError(dVar3,"glDeleteBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x398);
  }
  return bVar1;
}

Assistant:

bool ClearTest::TestClearNamedBufferData(glw::GLenum internalformat, glw::GLsizei count, glw::GLenum format,
										 glw::GLenum type, T* data)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint buffer   = 0;
	bool		is_ok	= true;
	bool		is_error = false;

	try
	{
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferData(buffer, static_cast<glw::GLsizei>(count * sizeof(T)), NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

		ClearNamedBuffer<USE_SUB_DATA>(buffer, internalformat, static_cast<glw::GLsizei>(count * sizeof(T)), format,
									   type, data);

		gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer failed.");

		T* _data = (T*)gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer failed.");

		is_ok = Compare<T>(_data, data, count);

		if (!is_ok)
		{
			/* Log. */
			LogFail<T>(USE_SUB_DATA, internalformat, _data, data, count);
		}

		gl.unmapBuffer(GL_ARRAY_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer failed.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		LogError(USE_SUB_DATA, internalformat);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
	}

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}